

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O0

void __thiscall CaDiCaL::Proof::flush_clause(Proof *this,Clause *c)

{
  byte bVar1;
  int iVar2;
  value_type_conflict5 vVar3;
  value_type_conflict5 *in_RSI;
  value_type_conflict5 *in_RDI;
  int64_t id;
  uint64_t id_1;
  uint uidx;
  int internal_lit;
  int i;
  bool antecedents;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  byte bVar4;
  Internal *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_18;
  
  bVar4 = 1;
  if ((*(byte *)(*in_RDI + 0x140) & 1) == 0) {
    bVar4 = *(byte *)(*in_RDI + 0x141);
  }
  bVar1 = bVar4 & 1;
  for (local_18 = 0; local_18 < (int)in_RSI[2]; local_18 = local_18 + 1) {
    in_stack_ffffffffffffffe4 = *(undefined4 *)((long)in_RSI + (long)local_18 * 4 + 0x18);
    iVar2 = Internal::fixed(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
    if (iVar2 < 0) {
      if (bVar1 != 0) {
        in_stack_ffffffffffffffe0 =
             Internal::vlit((Internal *)CONCAT17(bVar4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc);
        Internal::unit_clauses
                  ((Internal *)CONCAT17(bVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffffd0,in_RDI);
      }
    }
    else {
      add_literal((Proof *)CONCAT17(bVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffd0,
             in_RDI);
  *(byte *)(in_RDI + 8) = (byte)((uint)in_RSI[1] >> 0xb) & 1;
  vVar3 = *(long *)(*in_RDI + 0x58) + 1;
  *(value_type_conflict5 *)(*in_RDI + 0x58) = vVar3;
  in_RDI[7] = vVar3;
  add_derived_clause((Proof *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  delete_clause((Proof *)CONCAT17(bVar4,in_stack_ffffffffffffffc0),
                (Clause *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  *in_RSI = vVar3;
  return;
}

Assistant:

void Proof::flush_clause (Clause *c) {
  LOG (c, "PROOF flushing falsified literals in");
  assert (clause.empty ());
  const bool antecedents = (internal->lrat || internal->frat);
  for (int i = 0; i < c->size; i++) {
    int internal_lit = c->literals[i];
    if (internal->fixed (internal_lit) < 0) {
      if (antecedents) {
        const unsigned uidx = internal->vlit (-internal_lit);
        uint64_t id = internal->unit_clauses (uidx);
        assert (id);
        proof_chain.push_back (id);
      }
      continue;
    }
    add_literal (internal_lit);
  }
  proof_chain.push_back (c->id);
  redundant = c->redundant;
  int64_t id = ++internal->clause_id;
  clause_id = id;
  add_derived_clause ();
  delete_clause (c);
  c->id = id;
}